

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void printState(microseconds time,Timeline *timeline,size_t numPeers,double quantum)

{
  UdpSender *this;
  int rhs;
  ostream *poVar1;
  OutboundPacketStream *pOVar2;
  char *packet;
  size_t sVar3;
  double dVar4;
  double dVar5;
  int local_4ec;
  int i;
  undefined1 local_4d0 [8];
  OutboundPacketStream p;
  char buffer [1024];
  int usec;
  int sec;
  double timetag_ut;
  duration<long,_std::ratio<1L,_1000000000L>_> local_80;
  duration<long,_std::ratio<1L,_1000L>_> local_78;
  rep local_70;
  unsigned_long milliseconds_since_epoch;
  rep local_60;
  rep t;
  double cps;
  double cycle;
  double local_40;
  double phase;
  double local_30;
  double beats;
  double quantum_local;
  size_t numPeers_local;
  Timeline *timeline_local;
  microseconds time_local;
  
  phase = (double)time.__r;
  beats = quantum;
  quantum_local = (double)numPeers;
  numPeers_local = (size_t)timeline;
  timeline_local = (Timeline *)time.__r;
  local_30 = ableton::Link::Timeline::beatAtTime(timeline,time,quantum);
  cycle = (double)timeline_local;
  local_40 = ableton::Link::Timeline::phaseAtTime(timeline,(microseconds)timeline_local,beats);
  cps = local_30 / beats;
  dVar4 = ableton::Link::Timeline::tempo(timeline);
  t = (rep)((dVar4 / beats) / 60.0);
  milliseconds_since_epoch = (unsigned_long)timeline_local;
  local_60 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count
                       ((duration<long,_std::ratio<1L,_1000000L>_> *)&milliseconds_since_epoch);
  if (printState::diff == 0) {
    timetag_ut = (double)std::chrono::_V2::system_clock::now();
    local_80.__r = (rep)std::chrono::
                        time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                            *)&timetag_ut);
    local_78.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                  (&local_80);
    local_70 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_78);
    printState::diff = (local_70 * 1000 + 500) - local_60;
  }
  dVar4 = (double)(local_60 + printState::diff) / 1000000.0 - 0.2;
  dVar5 = floor(dVar4);
  rhs = (int)dVar5;
  dVar4 = floor((dVar4 - (double)rhs) * 1000000.0);
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::defaultfloat);
  poVar1 = std::operator<<(poVar1,"peers: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ulong)quantum_local);
  poVar1 = std::operator<<(poVar1," | ");
  poVar1 = std::operator<<(poVar1,"quantum: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,beats);
  poVar1 = std::operator<<(poVar1," | ");
  poVar1 = std::operator<<(poVar1,"tempo: ");
  dVar5 = ableton::Link::Timeline::tempo(timeline);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar5);
  poVar1 = std::operator<<(poVar1," | ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::fixed);
  poVar1 = std::operator<<(poVar1,"beats: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1," | sec: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rhs);
  poVar1 = std::operator<<(poVar1," | usec: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)dVar4);
  std::operator<<(poVar1," | ");
  if (((double)t != printState::last_cps) || (NAN((double)t) || NAN(printState::last_cps))) {
    osc::OutboundPacketStream::OutboundPacketStream
              ((OutboundPacketStream *)local_4d0,&p.messageIsInProgress_,0x400);
    poVar1 = std::operator<<((ostream *)&std::cout,"\nnew cps: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)t);
    poVar1 = std::operator<<(poVar1," | last cps: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,printState::last_cps);
    std::operator<<(poVar1,"\n");
    printState::last_cps = (double)t;
    osc::BeginMessage::BeginMessage((BeginMessage *)&stack0xfffffffffffffb18,"/tempo");
    pOVar2 = osc::OutboundPacketStream::operator<<
                       ((OutboundPacketStream *)local_4d0,(BeginMessage *)&stack0xfffffffffffffb18);
    pOVar2 = osc::OutboundPacketStream::operator<<(pOVar2,rhs);
    pOVar2 = osc::OutboundPacketStream::operator<<(pOVar2,(int)dVar4);
    pOVar2 = osc::OutboundPacketStream::operator<<(pOVar2,(float)cps);
    pOVar2 = osc::OutboundPacketStream::operator<<(pOVar2,(float)(double)t);
    pOVar2 = osc::OutboundPacketStream::operator<<(pOVar2,"True");
    osc::OutboundPacketStream::operator<<(pOVar2,(MessageTerminator *)&osc::EndMessage);
    this = sender;
    packet = osc::OutboundPacketStream::Data((OutboundPacketStream *)local_4d0);
    sVar3 = osc::OutboundPacketStream::Size((OutboundPacketStream *)local_4d0);
    UdpSender::Send(this,packet,(int)sVar3);
    osc::OutboundPacketStream::~OutboundPacketStream((OutboundPacketStream *)local_4d0);
  }
  for (local_4ec = 0; dVar4 = ceil(beats), (double)local_4ec < dVar4; local_4ec = local_4ec + 1) {
    if (local_40 <= (double)local_4ec) {
      std::operator<<((ostream *)&std::cout,'O');
    }
    else {
      std::operator<<((ostream *)&std::cout,'X');
    }
  }
  clearLine();
  return;
}

Assistant:

void printState(const std::chrono::microseconds time,
    const ableton::Link::Timeline timeline,
    const std::size_t numPeers,
    const double quantum)
{
  const auto beats = timeline.beatAtTime(time, quantum);
  const auto phase = timeline.phaseAtTime(time, quantum);
  const auto cycle = beats / quantum;
  const double cps = (timeline.tempo() / quantum) / 60;
  const auto t     = std::chrono::microseconds(time).count();
  static long diff = 0;
  static double last_cps = -1;
  //const auto time = state.link.clock().micros();
  
  if (diff == 0) {
    unsigned long milliseconds_since_epoch = 
      std::chrono::duration_cast<std::chrono::milliseconds>
      (std::chrono::system_clock::now().time_since_epoch()).count();
    // POSIX is millis and Link is micros.. Not sure if that `+500` helps
    diff = ((milliseconds_since_epoch*1000 + 500) - t);
  }
  double timetag_ut = ((double) (t + diff)) / ((double) 1000000);
  // latency hack
  timetag_ut -= 0.2;
  int sec = floor(timetag_ut);
  int usec = floor(1000000 * (timetag_ut - sec));

  std::cout << std::defaultfloat << "peers: " << numPeers << " | "
            << "quantum: " << quantum << " | "
            << "tempo: " << timeline.tempo() << " | " << std::fixed << "beats: " << beats
            << " | sec: " << sec
            << " | usec: " << usec
            << " | ";
  if (cps != last_cps) {
    //UdpBroadcastSocket s(IpEndpointName( "127.255.255.255", 6040));
    char buffer[OUTPUT_BUFFER_SIZE];
    osc::OutboundPacketStream p( buffer, OUTPUT_BUFFER_SIZE );
    std::cout << "\nnew cps: " << cps << " | last cps: " << last_cps << "\n";
    last_cps = cps;

    p << osc::BeginMessage( "/tempo" )
      << sec << usec
      << (float) cycle << (float) cps << "True" << osc::EndMessage;
    //s.Send( p.Data(), p.Size() );
    sender->Send((char *)p.Data(), p.Size());
  }
  for (int i = 0; i < ceil(quantum); ++i)
  {
    if (i < phase)
    {
      std::cout << 'X';
    }
    else
    {
      std::cout << 'O';
    }
  }
  clearLine();
}